

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmTable.c
# Opt level: O3

Nm_Entry_t * Nm_ManTableLookupName(Nm_Man_t *p,char *pName,int Type)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char cVar5;
  Nm_Entry_t *pNVar6;
  Nm_Entry_t *pNVar7;
  
  cVar5 = *pName;
  uVar1 = 0;
  if (cVar5 != '\0') {
    uVar3 = 1;
    uVar4 = 0;
    do {
      uVar1 = uVar1 ^ (int)cVar5 * (int)cVar5 *
                      (&Nm_HashString_s_Primes)[~((uVar4 / 10) * 10) + uVar3];
      uVar4 = uVar4 + 1;
      cVar5 = pName[uVar3];
      uVar3 = uVar3 + 1;
    } while (cVar5 != '\0');
  }
  pNVar7 = p->pBinsN2I[(ulong)uVar1 % (ulong)(uint)p->nBins];
  do {
    if (pNVar7 == (Nm_Entry_t *)0x0) {
      return (Nm_Entry_t *)0x0;
    }
    iVar2 = strcmp((char *)(pNVar7 + 1),pName);
    if (iVar2 == 0) {
      if (Type == -1) {
        return pNVar7;
      }
      if (pNVar7->Type == Type) {
        return pNVar7;
      }
    }
    pNVar6 = pNVar7->pNameSake;
    if (pNVar6 != pNVar7 && pNVar6 != (Nm_Entry_t *)0x0) {
      do {
        iVar2 = strcmp((char *)(pNVar6 + 1),pName);
        if (iVar2 == 0) {
          if (Type == -1) {
            return pNVar6;
          }
          if (pNVar6->Type == Type) {
            return pNVar6;
          }
        }
        pNVar6 = pNVar6->pNameSake;
      } while (pNVar6 != pNVar7);
    }
    pNVar7 = pNVar7->pNextN2I;
  } while( true );
}

Assistant:

Nm_Entry_t * Nm_ManTableLookupName( Nm_Man_t * p, char * pName, int Type )
{
    Nm_Entry_t * pEntry, * pTemp;
    for ( pEntry = p->pBinsN2I[ Nm_HashString(pName, p->nBins) ]; pEntry; pEntry = pEntry->pNextN2I )
    {
        // check the entry itself
        if ( !strcmp(pEntry->Name, pName) && (Type == -1 || pEntry->Type == (unsigned)Type) )
            return pEntry;
        // if there is no namesakes, continue
        if ( pEntry->pNameSake == NULL )
            continue;
        // check the list of namesakes
        for ( pTemp = pEntry->pNameSake; pTemp != pEntry; pTemp = pTemp->pNameSake )
            if ( !strcmp(pTemp->Name, pName) && (Type == -1 || pTemp->Type == (unsigned)Type) )
                return pTemp;
    }
    return NULL;
}